

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

void recff_cdata_arith(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  CType *pCVar2;
  TValue *pTVar3;
  int32_t k;
  short sVar4;
  bool bVar5;
  IRRef1 IVar6;
  IRType IVar7;
  TRef TVar8;
  TRef TVar9;
  CTSize CVar10;
  CTypeID CVar11;
  GCcdata *pGVar12;
  CType *pCVar13;
  cTValue *pcVar14;
  TRef *pTVar15;
  ushort uVar16;
  ushort uVar17;
  IROpT IVar18;
  uint uVar19;
  uint **ppuVar20;
  ulong uVar21;
  uint *puVar22;
  ulong uVar23;
  ulong uVar24;
  undefined4 uVar25;
  uint **ppuVar26;
  CTState *pCVar27;
  GCobj *o;
  bool bVar28;
  uint uVar29;
  uint *puVar30;
  uint *puVar31;
  IRRef1 IVar32;
  TRef sp [2];
  CType *s [2];
  CTSize ofs;
  uint local_88 [2];
  CTState *local_80;
  ulong local_78;
  uint **local_70;
  RecordFFData *local_68;
  uint *local_60;
  uint *local_58 [3];
  uint local_40;
  CTSize local_3c;
  ulong local_38;
  
  pCVar27 = (CTState *)(ulong)*(uint *)((ulong)(J->L->glref).ptr32 + 0x194);
  pCVar27->L = J->L;
  uVar1 = rd->data;
  local_40 = uVar1 & 0xfffffffc;
  puVar30 = local_88;
  ppuVar20 = local_58;
  uVar24 = CONCAT71((int7)((ulong)rd >> 8),1);
  uVar21 = 0;
  local_80 = pCVar27;
  local_68 = rd;
LAB_00158d44:
  do {
    uVar29 = J->base[uVar21];
    if (uVar29 == 0) goto LAB_001599d8;
    uVar19 = uVar29 & 0x1f000000;
    ppuVar26 = ppuVar20;
    if (uVar19 == 0) {
      if (local_40 != 4) goto LAB_001599d8;
      uVar29 = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
      pCVar13 = pCVar27->tab + 0x11;
      uVar24 = uVar24 & 0xffffffff;
    }
    else {
      IVar32 = (IRRef1)uVar29;
      if (uVar19 == 0xa000000) {
        local_78 = CONCAT44(local_78._4_4_,(int)uVar24);
        local_70 = ppuVar20;
        local_60 = puVar30;
        pGVar12 = argv2cdata(J,uVar29,local_68->argv + uVar21);
        local_38 = (ulong)pGVar12->ctypeid;
        pCVar2 = pCVar27->tab;
        uVar29 = pCVar2[local_38].info;
        pCVar13 = pCVar2 + local_38;
        IVar7 = crec_ct2irt(pCVar27,pCVar13);
        puVar30 = local_58[0];
        uVar29 = uVar29 >> 0x1c;
        uVar17 = (ushort)IVar7;
        if (uVar29 == 2) {
          (J->fold).ins.field_0.ot = uVar17 | 0x4400;
          (J->fold).ins.field_0.op1 = IVar32;
          (J->fold).ins.field_0.op2 = 0xf;
          uVar29 = lj_opt_fold(J);
          uVar19 = pCVar13->info;
          if ((uVar19 & 0xf0800000) == 0x20800000) {
            uVar21 = (ulong)((uVar19 & 0xffff) << 4);
            uVar19 = *(uint *)((long)&local_80->tab->info + uVar21);
            pCVar13 = (CType *)((long)&local_80->tab->info + uVar21);
            IVar7 = crec_ct2irt(local_80,pCVar13);
          }
LAB_001591e8:
          puVar30 = local_60;
          uVar24 = local_78 & 0xffffffff;
          if ((uVar19 & 0xf0000000) == 0x50000000) {
            uVar21 = (ulong)((uVar19 & 0xffff) << 4);
            pCVar13 = (CType *)((long)&local_80->tab->info + uVar21);
            uVar19 = *(uint *)((long)&local_80->tab->info + uVar21);
          }
          ppuVar26 = local_70;
          pCVar27 = local_80;
          if (uVar19 < 0x10000000) {
            if (IVar7 == IRT_CDATA) {
              uVar29 = 0;
            }
            else {
              (J->fold).ins.field_0.ot = (ushort)IVar7 | 0x4500;
              (J->fold).ins.field_0.op1 = (IRRef1)uVar29;
              (J->fold).ins.field_0.op2 = 0;
              uVar29 = lj_opt_fold(J);
              uVar24 = local_78 & 0xffffffff;
              ppuVar26 = local_70;
              pCVar27 = local_80;
            }
          }
        }
        else {
          if (IVar7 - IRT_I64 < 2) {
            (J->fold).ins.field_0.ot = uVar17 | 0x4400;
            (J->fold).ins.field_0.op1 = IVar32;
            (J->fold).ins.field_0.op2 = 0x11;
            uVar29 = lj_opt_fold(J);
            pCVar27 = local_80;
          }
          else {
            if (1 < IVar7 - IRT_IGC) {
              if (uVar29 != 6) {
                TVar8 = lj_ir_kint64(J,8);
                (J->fold).ins.field_0.ot = 0x2909;
                (J->fold).ins.field_0.op1 = IVar32;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
                uVar29 = lj_opt_fold(J);
                uVar19 = pCVar13->info;
                goto LAB_001591e8;
              }
              (J->fold).ins.field_0.op1 = IVar32;
              *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4409000f;
              TVar8 = lj_opt_fold(J);
              pCVar27 = local_80;
              CVar11 = lj_ctype_intern(local_80,(uint)local_38 | 0x20030000,8);
              pCVar13 = pCVar27->tab + CVar11;
              if ((local_78 & 1) == 0) {
                local_58[0] = (uint *)((long)&pCVar27->tab->info +
                                      ((long)puVar30 - (long)pCVar2 & 0xffffffff0U));
                local_58[uVar21] = &pCVar13->info;
                local_88[uVar21] = TVar8;
                break;
              }
              *local_70 = &pCVar13->info;
              *local_60 = TVar8;
              uVar21 = 1;
              uVar24 = 0;
              ppuVar20 = local_58 + 1;
              puVar30 = local_88 + 1;
              goto LAB_00158d44;
            }
            (J->fold).ins.field_0.ot = uVar17 | 0x4400;
            (J->fold).ins.field_0.op1 = IVar32;
            (J->fold).ins.field_0.op2 = 0x10;
            uVar29 = lj_opt_fold(J);
            pCVar27 = local_80;
            if ((pCVar13->info & 0xf0000000) == 0x50000000) {
              pCVar13 = (CType *)((long)&local_80->tab->info +
                                 (ulong)((pCVar13->info & 0xffff) << 4));
            }
          }
LAB_00159035:
          uVar24 = local_78 & 0xffffffff;
          ppuVar26 = local_70;
          puVar30 = local_60;
        }
      }
      else {
        pCVar13 = pCVar27->tab;
        if ((uVar29 >> 0x18 & 0x1f) - 0xf < 5) {
          pCVar13 = pCVar13 + 9;
        }
        else if (uVar19 == 0xe000000) {
          pCVar13 = pCVar13 + 0xe;
        }
        else if (uVar19 == 0x4000000) {
          local_78 = CONCAT44(local_78._4_4_,(int)uVar24);
          local_70 = ppuVar20;
          pGVar12 = argv2cdata(J,J->base[uVar21 ^ 1],local_68->argv + (uVar21 ^ 1));
          pCVar13 = pCVar27->tab + pGVar12->ctypeid;
          uVar29 = pCVar27->tab[pGVar12->ctypeid].info >> 0x1c;
          if (uVar29 != 2) {
            local_60 = puVar30;
            if (uVar29 == 5) {
              o = (GCobj *)(ulong)local_68->argv[uVar21].u32.lo;
              pCVar13 = lj_ctype_getfieldq(local_80,pCVar13,&o->str,&local_3c,(CTInfo *)0x0);
              if ((pCVar13 != (CType *)0x0) && ((pCVar13->info & 0xf0000000) == 0xb0000000)) {
                TVar8 = lj_ir_kgc(J,o,IRT_STR);
                (J->fold).ins.field_0.ot = 0x884;
                (J->fold).ins.field_0.op1 = IVar32;
                (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
                lj_opt_fold(J);
                pCVar27 = local_80;
                pCVar13 = local_80->tab + (ushort)pCVar13->info;
                uVar29 = lj_ir_kint(J,local_3c);
                goto LAB_00159035;
              }
            }
            goto LAB_001599d8;
          }
          TVar8 = lj_ir_kint64(J,0x10);
          (J->fold).ins.field_0.ot = 0x2909;
          (J->fold).ins.field_0.op1 = IVar32;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
          uVar29 = lj_opt_fold(J);
          uVar24 = local_78 & 0xffffffff;
          ppuVar26 = local_70;
        }
        else {
          pCVar13 = pCVar13 + 0x11;
          uVar29 = 0;
        }
      }
    }
    ppuVar20 = local_58 + 1;
    *ppuVar26 = &pCVar13->info;
    *puVar30 = uVar29;
    uVar21 = 1;
    puVar30 = local_88 + 1;
    uVar23 = uVar24 & 1;
    uVar24 = 0;
  } while (uVar23 != 0);
  puVar22 = local_58[1];
  puVar30 = local_58[0];
  if ((((uVar1 == 5) || (uVar1 == 8)) || (uVar21 = (ulong)local_88[0], uVar21 == 0)) ||
     (uVar24 = (ulong)local_88[1], uVar24 == 0)) goto LAB_001597ea;
  uVar29 = *local_58[0];
  if ((uVar29 < 0x10000000) && (uVar19 = *local_58[1], uVar19 < 0x10000000)) {
    if ((((uVar29 >> 0x17 & 1) == 0) || (local_58[0][1] != 8)) &&
       (((uVar19 >> 0x17 & 1) == 0 || (local_58[1][1] != 8)))) {
      local_78 = 0x15;
      uVar25 = 0xb;
      if (((9 < uVar1) ||
          (((((uVar19 | uVar29) >> 0x1a & 1) != 0 || (local_58[0][1] != 4)) || (local_58[1][1] != 4)
           ))) || (((((uVar19 ^ uVar29) >> 0x17 & 1) != 0 &&
                    (((short)local_88[1] < 0 || ((J->cur).ir[local_88[1] & 0x7fff].i < 0)))) &&
                   (((short)local_88[0] < 0 ||
                    (uVar29 = uVar19, (J->cur).ir[local_88[0] & 0x7fff].i < 0))))))
      goto LAB_001593ad;
      uVar29 = ((uVar29 >> 0x17 & 1) != 0) + 0x13;
    }
    else {
      local_78 = 0x16;
      uVar25 = 0xc;
LAB_001593ad:
      local_70 = (uint **)CONCAT44(local_70._4_4_,uVar25);
      sVar4 = (short)local_78;
      uVar17 = sVar4 * 0x20;
      puVar31 = local_88;
      ppuVar20 = local_58;
      bVar5 = true;
      do {
        bVar28 = bVar5;
        uVar29 = *puVar31;
        uVar19 = uVar29 >> 0x18 & 0x1f;
        if (uVar19 - 0xd < 2) {
          uVar16 = (short)uVar19 + uVar17 + 0x1000;
LAB_0015940e:
          (J->fold).ins.field_0.ot = sVar4 + 0x5900;
          (J->fold).ins.field_0.op1 = (IRRef1)uVar29;
          (J->fold).ins.field_0.op2 = uVar16;
          TVar8 = lj_opt_fold(J);
          *puVar31 = TVar8;
        }
        else if (1 < uVar19 - 0x15) {
          uVar16 = ((ushort)(**ppuVar20 >> 0xc) & 0x800 | uVar17) ^ 0x813;
          goto LAB_0015940e;
        }
        uVar19 = local_88[1];
        uVar29 = local_88[0];
        ppuVar20 = local_58 + 1;
        puVar31 = local_88 + 1;
        bVar5 = false;
      } while (bVar28);
      if (9 < uVar1) {
        uVar21 = (ulong)local_88[0];
        uVar24 = (ulong)local_88[1];
        (J->fold).ins.field_0.ot = (short)(uVar1 << 8) + (short)local_78 + 0x1f00;
        (J->fold).ins.field_0.op1 = (IRRef1)local_88[0];
        (J->fold).ins.field_0.op2 = (IRRef1)local_88[1];
        TVar8 = lj_opt_fold(J);
        TVar9 = lj_ir_kint(J,(int32_t)local_70);
        (J->fold).ins.field_0.ot = 0x528a;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
        TVar8 = lj_opt_fold(J);
        if (TVar8 != 0) goto LAB_0015996e;
        if (uVar19 == 0 || uVar29 == 0) goto LAB_001597ea;
        goto LAB_0015951d;
      }
      uVar29 = (uint)local_78;
    }
    uVar17 = 0x800;
    if (uVar1 != 4) {
      uVar16 = (ushort)(uVar1 != 6) * 0x200;
      uVar17 = uVar16 + 0x400;
      if ((uVar29 & 0xfffffffd) != 0x14) {
        uVar17 = uVar16;
      }
    }
    uVar17 = uVar17 | (ushort)uVar29 | 0x80;
    uVar21 = (ulong)local_88[0];
    uVar24 = (ulong)local_88[1];
    goto LAB_00159949;
  }
LAB_0015951d:
  pCVar27 = (CTState *)(ulong)J[-1].bpropcache[0xc].mode;
  uVar29 = *puVar30;
  if ((uVar29 & 0xf0000000) == 0x20000000 || (uVar29 & 0xfc000000) == 0x30000000) {
    if (((0xb < uVar1) || ((0x8d0U >> (uVar1 & 0x1f) & 1) == 0)) ||
       ((*puVar22 & 0xf0000000) != 0x20000000 && (*puVar22 & 0xfc000000) != 0x30000000)) {
      if (((uVar1 & 0xfffffffe) == 10) &&
         (uVar19 = *puVar22, puVar22 = puVar30, uVar23 = uVar24, uVar24 = uVar21,
         uVar19 < 0x10000000)) goto LAB_001596a4;
      goto LAB_001597ea;
    }
    if (uVar1 == 4) {
      uVar17 = 0x889;
    }
    else {
      if (uVar1 == 0xb) {
        CVar10 = lj_ctype_size(pCVar27,uVar29 & 0xffff);
        if ((CVar10 ^ CVar10 - 1) <= CVar10 - 1) goto LAB_001597ea;
        (J->fold).ins.field_0.ot = 0x2a15;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar21;
        (J->fold).ins.field_0.op2 = (IRRef1)uVar24;
        TVar8 = lj_opt_fold(J);
        k = 0x1f;
        if (CVar10 != 0) {
          for (; CVar10 >> k == 0; k = k + -1) {
          }
        }
        TVar9 = lj_ir_kint(J,k);
        (J->fold).ins.field_0.ot = 0x2615;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar9;
        TVar8 = lj_opt_fold(J);
        IVar6 = (IRRef1)TVar8;
        IVar32 = 0x1d5;
        IVar18 = 0x590e;
        goto LAB_001597bd;
      }
      uVar17 = (ushort)(uVar1 != 6) << 9 | 0x489;
    }
  }
  else {
    if ((uVar29 < 0x10000000 && uVar1 == 10) &&
       (uVar29 = *puVar22,
       (uVar29 & 0xf0000000) == 0x20000000 || (uVar29 & 0xfc000000) == 0x30000000)) {
      local_88[0] = (uint)uVar24;
      local_88[1] = (uint)uVar21;
      uVar23 = uVar21;
LAB_001596a4:
      uVar19 = (uint)(uVar23 >> 0x18) & 0x1f;
      CVar10 = lj_ctype_size(pCVar27,uVar29 & 0xffff);
      if (uVar19 - 0xd < 2) {
        IVar32 = (ushort)uVar19 | 0x12a0;
LAB_00159714:
        (J->fold).ins.field_0.ot = 0x5915;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar23;
        (J->fold).ins.field_0.op2 = IVar32;
        TVar8 = lj_opt_fold(J);
        uVar23 = (ulong)TVar8;
      }
      else if (1 < uVar19 - 0x15) {
        IVar32 = (ushort)(uVar23 >> 0xd) & 0x800 | 0x2b3;
        goto LAB_00159714;
      }
      TVar8 = lj_ir_kint64(J,(ulong)CVar10);
      (J->fold).ins.field_0.ot = 0x2b15;
      (J->fold).ins.field_0.op1 = (IRRef1)uVar23;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
      TVar8 = lj_opt_fold(J);
      (J->fold).ins.field_0.ot = (short)(uVar1 << 8) + 0x1f09;
      (J->fold).ins.field_0.op1 = (IRRef1)uVar24;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar8;
      TVar8 = lj_opt_fold(J);
      IVar32 = (IRRef1)TVar8;
      CVar11 = lj_ctype_intern(pCVar27,(ushort)*puVar22 | 0x20030000,8);
      TVar8 = lj_ir_kint(J,CVar11);
      IVar6 = (IRRef1)TVar8;
      IVar18 = 0x528a;
LAB_001597bd:
      (J->fold).ins.field_0.ot = IVar18;
      (J->fold).ins.field_0.op1 = IVar6;
      (J->fold).ins.field_0.op2 = IVar32;
      TVar8 = lj_opt_fold(J);
      if (TVar8 != 0) goto LAB_0015996e;
    }
LAB_001597ea:
    pCVar27 = local_80;
    pTVar15 = J->base;
    if (*pTVar15 != 0) {
      if ((local_68->argv->field_2).it == 0xfffffff5) {
        pGVar12 = argv2cdata(J,*pTVar15,local_68->argv);
        uVar1 = pCVar27->tab[pGVar12->ctypeid].info;
        uVar29 = (uint)pGVar12->ctypeid;
        if ((uVar1 & 0xf0000000) == 0x20000000) {
          uVar29 = uVar1 & 0xffff;
        }
        pcVar14 = lj_ctype_meta(pCVar27,uVar29,local_68->data);
        if (pcVar14 == (cTValue *)0x0) {
          pTVar15 = J->base;
          goto LAB_0015985f;
        }
LAB_001598c6:
        if ((pcVar14->field_2).it == 0xfffffff7) {
          TVar8 = lj_ir_kgc(J,(GCobj *)(ulong)(pcVar14->u32).lo,IRT_FUNC);
          J->base[-1] = TVar8 | 0x10000;
          local_68->nres = -1;
          return;
        }
        goto LAB_001599d8;
      }
LAB_0015985f:
      if ((pTVar15[1] != 0) && (*(int *)((long)local_68->argv + 0xc) == -0xb)) {
        pGVar12 = argv2cdata(J,pTVar15[1],local_68->argv + 1);
        uVar1 = pCVar27->tab[pGVar12->ctypeid].info;
        uVar29 = (uint)pGVar12->ctypeid;
        if ((uVar1 & 0xf0000000) == 0x20000000) {
          uVar29 = uVar1 & 0xffff;
        }
        pcVar14 = lj_ctype_meta(pCVar27,uVar29,local_68->data);
        if (pcVar14 != (cTValue *)0x0) goto LAB_001598c6;
      }
    }
    if (local_68->data != 4) {
LAB_001599d8:
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    uVar21 = (ulong)local_88[0];
    TVar8 = 0x1007ffe;
    if (((local_88[0] == 0) || (uVar24 = (ulong)local_88[1], local_88[1] == 0)) ||
       (uVar17 = 0x889, 0xfffffff < *local_58[1] == *local_58[0] < 0x10000000)) goto LAB_0015996e;
  }
LAB_00159949:
  (J->fold).ins.field_0.ot = uVar17;
  (J->fold).ins.field_0.op1 = (IRRef1)uVar21;
  (J->fold).ins.field_0.op2 = (IRRef1)uVar24;
  J->postproc = LJ_POST_FIXGUARD;
  TVar8 = 0x2007ffd;
LAB_0015996e:
  *J->base = TVar8;
  if (((J->postproc == LJ_POST_FIXGUARD) &&
      (pTVar3 = J->L->base, ((ulong)*pTVar3 & 0x700000000) == 0x200000000)) &&
     ((-1 < (char)(J->guardemit).irt &&
      (uVar21 = (ulong)*(uint *)((long)pTVar3 + -0xc), (*(uint *)(uVar21 - 4) & 0xfc) < 0xc)))) {
    *(ulong *)&J[-1].penaltyslot = uVar21 - 4;
    J->postproc = LJ_POST_FIXCOMP;
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_cdata_arith(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_cts(J->L);
  MMS mm = (MMS)rd->data;
  TRef sp[2];
  CType *s[2];
  MSize i;
  for (i = 0; i < 2; i++) {
    TRef tr = J->base[i];
    CType *ct = ctype_get(cts, CTID_DOUBLE);
    if (!tr) {
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    } else if (tref_iscdata(tr)) {
      CTypeID id = argv2cdata(J, tr, &rd->argv[i])->ctypeid;
      IRType t;
      ct = ctype_raw(cts, id);
      t = crec_ct2irt(cts, ct);
      if (ctype_isptr(ct->info)) {  /* Resolve pointer or reference. */
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_PTR);
	if (ctype_isref(ct->info)) {
	  ct = ctype_rawchild(cts, ct);
	  t = crec_ct2irt(cts, ct);
	}
      } else if (t == IRT_I64 || t == IRT_U64) {
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_INT64);
	lj_needsplit(J);
	goto ok;
      } else if (t == IRT_INT || t == IRT_U32) {
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_INT);
	if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
	goto ok;
      } else if (ctype_isfunc(ct->info)) {
	CTypeID id0 = i ? ctype_typeid(cts, s[0]) : 0;
	tr = emitir(IRT(IR_FLOAD, IRT_PTR), tr, IRFL_CDATA_PTR);
	ct = ctype_get(cts,
	  lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|id), CTSIZE_PTR));
	if (i) {
	  s[0] = ctype_get(cts, id0);  /* cts->tab may have been reallocated. */
	}
	goto ok;
      } else {
	tr = emitir(IRT(IR_ADD, IRT_PTR), tr, lj_ir_kintp(J, sizeof(GCcdata)));
      }
      if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
      if (ctype_isnum(ct->info)) {
	if (t == IRT_CDATA) {
	  tr = 0;
	} else {
	  if (t == IRT_I64 || t == IRT_U64) lj_needsplit(J);
	  tr = emitir(IRT(IR_XLOAD, t), tr, 0);
	}
      }
    } else if (tref_isnil(tr)) {
      if (!(mm == MM_len || mm == MM_eq || mm == MM_lt || mm == MM_le))
	lj_trace_err(J, LJ_TRERR_BADTYPE);
      tr = lj_ir_kptr(J, NULL);
      ct = ctype_get(cts, CTID_P_VOID);
    } else if (tref_isinteger(tr)) {
      ct = ctype_get(cts, CTID_INT32);
    } else if (tref_isstr(tr)) {
      TRef tr2 = J->base[1-i];
      CTypeID id = argv2cdata(J, tr2, &rd->argv[1-i])->ctypeid;
      ct = ctype_raw(cts, id);
      if (ctype_isenum(ct->info)) {  /* Match string against enum constant. */
	GCstr *str = strV(&rd->argv[i]);
	CTSize ofs;
	CType *cct = lj_ctype_getfield(cts, ct, str, &ofs);
	if (cct && ctype_isconstval(cct->info)) {
	  /* Specialize to the name of the enum constant. */
	  emitir(IRTG(IR_EQ, IRT_STR), tr, lj_ir_kstr(J, str));
	  ct = ctype_child(cts, cct);
	  tr = lj_ir_kint(J, (int32_t)ofs);
	} else {  /* Interpreter will throw or return false. */
	  lj_trace_err(J, LJ_TRERR_BADTYPE);
	}
      } else if (ctype_isptr(ct->info)) {
	tr = emitir(IRT(IR_ADD, IRT_PTR), tr, lj_ir_kintp(J, sizeof(GCstr)));
      } else {
	lj_trace_err(J, LJ_TRERR_BADTYPE);
      }
    } else if (!tref_isnum(tr)) {
      tr = 0;
      ct = ctype_get(cts, CTID_P_VOID);
    }
  ok:
    s[i] = ct;
    sp[i] = tr;
  }
  {
    TRef tr;
    if ((mm == MM_len || mm == MM_concat ||
	 (!(tr = crec_arith_int64(J, sp, s, mm)) &&
	  !(tr = crec_arith_ptr(J, sp, s, mm)))) &&
	!(tr = crec_arith_meta(J, sp, s, cts, rd)))
      return;
    J->base[0] = tr;
    /* Fixup cdata comparisons, too. Avoids some cdata escapes. */
    if (J->postproc == LJ_POST_FIXGUARD && frame_iscont(J->L->base-1) &&
	!irt_isguard(J->guardemit)) {
      const BCIns *pc = frame_contpc(J->L->base-1) - 1;
      if (bc_op(*pc) <= BC_ISNEP) {
	J2G(J)->tmptv.u64 = (uint64_t)(uintptr_t)pc;
	J->postproc = LJ_POST_FIXCOMP;
      }
    }
  }
}